

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O1

void rw::d3d9::defaultInstanceCB(Geometry *geo,InstanceDataHeader *header,bool32 reinstance)

{
  uint16 *puVar1;
  short *psVar2;
  ushort *puVar3;
  uint uVar4;
  int iVar5;
  uint32 uVar6;
  void *pvVar7;
  uint8 *puVar8;
  char *pcVar9;
  byte *pbVar10;
  long lVar11;
  ushort uVar12;
  uint32 uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint32 *puVar17;
  VertexElement dcl [12];
  ushort local_98 [2];
  byte abStack_94 [100];
  
  uVar4 = geo->flags;
  if (reinstance == 0) {
    header->vertexStream[0].offset = 0;
    header->vertexStream[0].geometryFlags = 0;
    header->vertexStream[0].managed = '\x01';
    header->vertexStream[0].dynamicLock = '\0';
    _local_98 = 0x200000000;
    header->vertexStream[0].geometryFlags = 2;
    if ((uVar4 & 8) == 0) {
      uVar14 = 1;
      uVar12 = 0xc;
    }
    else {
      abStack_94[4] = 0;
      abStack_94[5] = 0;
      abStack_94[6] = 0xc;
      abStack_94[7] = 0;
      abStack_94[8] = 4;
      abStack_94[9] = 0;
      abStack_94[10] = 10;
      abStack_94[0xb] = 0;
      header->vertexStream[0].geometryFlags = 10;
      uVar14 = 2;
      uVar12 = 0x10;
    }
    iVar5 = geo->numTexCoordSets;
    if (0 < iVar5) {
      uVar15 = (uint)header->vertexStream[0].geometryFlags;
      uVar16 = (ulong)uVar14;
      lVar11 = 0;
      do {
        local_98[uVar16 * 4 + lVar11 * 4] = 0;
        local_98[uVar16 * 4 + lVar11 * 4 + 1] = uVar12;
        local_98[uVar16 * 4 + lVar11 * 4 + 2] = 1;
        *(undefined1 *)(local_98 + uVar16 * 4 + lVar11 * 4 + 3) = 5;
        *(byte *)((long)local_98 + lVar11 * 8 + uVar16 * 8 + 7) = (byte)lVar11;
        uVar15 = uVar15 | 0x10 << ((byte)lVar11 & 0x1f);
        uVar12 = uVar12 + 8;
        lVar11 = lVar11 + 1;
      } while (iVar5 != (int)lVar11);
      uVar14 = uVar14 + (int)lVar11;
      header->vertexStream[0].geometryFlags = (uint16)uVar15;
    }
    if ((uVar4 & 0x10) != 0) {
      uVar16 = (ulong)uVar14;
      local_98[uVar16 * 4] = 0;
      local_98[uVar16 * 4 + 1] = uVar12;
      (local_98 + uVar16 * 4 + 2)[0] = 2;
      (local_98 + uVar16 * 4 + 2)[1] = 3;
      uVar14 = uVar14 + 1;
      puVar1 = &header->vertexStream[0].geometryFlags;
      *(byte *)puVar1 = (byte)*puVar1 | 4;
      uVar12 = uVar12 + 0xc;
    }
    if ((uVar4 & 8) == 0) {
      puVar3 = local_98 + (long)(int)uVar14 * 4;
      puVar3[0] = 2;
      puVar3[1] = 0xc;
      puVar3[2] = 4;
      puVar3[3] = 10;
      uVar14 = uVar14 + 1;
    }
    if (iVar5 == 0) {
      puVar3 = local_98 + (long)(int)uVar14 * 4;
      puVar3[0] = 2;
      puVar3[1] = 0x10;
      puVar3[2] = 1;
      puVar3[3] = 5;
      uVar14 = uVar14 + 1;
    }
    puVar3 = local_98 + (long)(int)uVar14 * 4;
    puVar3[0] = 0xff;
    puVar3[1] = 0;
    puVar3[2] = 0x11;
    puVar3[3] = 0;
    header->vertexStream[0].stride = (uint)uVar12;
    uVar16 = 0;
    do {
      psVar2 = (short *)((long)local_98 + uVar16);
      uVar16 = uVar16 + 8;
    } while (*psVar2 != 0xff);
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d9.cpp line: 84"
    ;
    pvVar7 = (void *)(*DAT_00149da8)(uVar16 & 0x7fffffff8,0x30b00);
    memcpy(pvVar7,local_98,uVar16 & 0x7fffffff8);
    header->vertexDeclaration = pvVar7;
    pvVar7 = d3d::createVertexBuffer
                       (header->vertexStream[0].stride * header->totalNumVertex,0,false);
    header->vertexStream[0].vertexBuffer = pvVar7;
  }
  else {
    uVar16 = 0;
    do {
      psVar2 = (short *)((long)header->vertexDeclaration + uVar16);
      uVar16 = uVar16 + 8;
    } while (*psVar2 != 0xff);
    memcpy(local_98,header->vertexDeclaration,uVar16 & 0x7fffffff8);
  }
  puVar8 = d3d::lockVertices(header->vertexStream[0].vertexBuffer,0,0,0);
  if ((reinstance == 0) || ((geo->lockedSinceInst & 2) != 0)) {
    for (pcVar9 = (char *)((long)local_98 + 7); (pcVar9[-1] != '\0' || (*pcVar9 != '\0'));
        pcVar9 = pcVar9 + 8) {
    }
    instV3d(*(int *)(d3d::vertFormatMap + (ulong)(byte)pcVar9[-3] * 4),
            puVar8 + *(ushort *)(pcVar9 + -5),geo->morphTargets->vertices,header->totalNumVertex,
            header->vertexStream[*(ushort *)(pcVar9 + -7)].stride);
  }
  if (((uVar4 & 8) != 0) && ((reinstance == 0 || ((geo->lockedSinceInst & 8) != 0)))) {
    for (pcVar9 = (char *)((long)local_98 + 7); (pcVar9[-1] != '\n' || (*pcVar9 != '\0'));
        pcVar9 = pcVar9 + 8) {
    }
    uVar13 = header->numMeshes;
    if (uVar13 != 0) {
      puVar17 = &header->inst->numVertices;
      do {
        uVar6 = header->vertexStream[*(ushort *)(pcVar9 + -7)].stride;
        uVar6 = instColor(*(int *)(d3d::vertFormatMap + (ulong)(byte)pcVar9[-3] * 4),
                          puVar8 + (ulong)(puVar17[-8] * uVar6) + (ulong)*(ushort *)(pcVar9 + -5),
                          geo->colors + puVar17[-8],*puVar17,uVar6);
        puVar17[-5] = uVar6;
        puVar17 = puVar17 + 0xc;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
  }
  if (0 < geo->numTexCoordSets) {
    uVar16 = 0;
    do {
      pbVar10 = (byte *)((long)local_98 + 7);
      if ((reinstance == 0) || ((geo->lockedSinceInst >> ((byte)uVar16 & 0x1f) & 0x10) != 0)) {
        for (; (pbVar10[-1] != 5 || (uVar16 != *pbVar10)); pbVar10 = pbVar10 + 8) {
        }
        instTexCoords(*(int *)(d3d::vertFormatMap + (ulong)pbVar10[-3] * 4),
                      puVar8 + *(ushort *)(pbVar10 + -5),geo->texCoords[uVar16],
                      header->totalNumVertex,header->vertexStream[*(ushort *)(pbVar10 + -7)].stride)
        ;
      }
      uVar16 = uVar16 + 1;
    } while ((long)uVar16 < (long)geo->numTexCoordSets);
  }
  if (((uVar4 & 0x10) != 0) && ((reinstance == 0 || ((geo->lockedSinceInst & 4) != 0)))) {
    for (pcVar9 = (char *)((long)local_98 + 7); (pcVar9[-1] != '\x03' || (*pcVar9 != '\0'));
        pcVar9 = pcVar9 + 8) {
    }
    instV3d(*(int *)(d3d::vertFormatMap + (ulong)(byte)pcVar9[-3] * 4),
            puVar8 + *(ushort *)(pcVar9 + -5),geo->morphTargets->normals,header->totalNumVertex,
            header->vertexStream[*(ushort *)(pcVar9 + -7)].stride);
  }
  d3d::unlockVertices(header->vertexStream[0].vertexBuffer);
  return;
}

Assistant:

void
defaultInstanceCB(Geometry *geo, InstanceDataHeader *header, bool32 reinstance)
{
	int i = 0;
	VertexElement dcl[NUMDECLELT];
	VertexStream *s = &header->vertexStream[0];

	bool isPrelit = (geo->flags & Geometry::PRELIT) != 0;
	bool hasNormals = (geo->flags & Geometry::NORMALS) != 0;

	// TODO: support both vertex buffers

	if(!reinstance){
		// Create declarations and buffers only the first time

		assert(s->vertexBuffer == nil);
		s->offset = 0;
		s->managed = 1;
		s->geometryFlags = 0;
		s->dynamicLock = 0;

		dcl[i].stream = 0;
		dcl[i].offset = 0;
		dcl[i].type = D3DDECLTYPE_FLOAT3;
		dcl[i].method = D3DDECLMETHOD_DEFAULT;
		dcl[i].usage = D3DDECLUSAGE_POSITION;
		dcl[i].usageIndex = 0;
		i++;
		uint16 stride = 12;
		s->geometryFlags |= 0x2;

		if(isPrelit){
			dcl[i].stream = 0;
			dcl[i].offset = stride;
			dcl[i].type = D3DDECLTYPE_D3DCOLOR;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_COLOR;
			dcl[i].usageIndex = 0;
			i++;
			s->geometryFlags |= 0x8;
			stride += 4;
		}

		for(int32 n = 0; n < geo->numTexCoordSets; n++){
			dcl[i].stream = 0;
			dcl[i].offset = stride;
			dcl[i].type = D3DDECLTYPE_FLOAT2;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_TEXCOORD;
			dcl[i].usageIndex = (uint8)n;
			i++;
			s->geometryFlags |= 0x10 << n;
			stride += 8;
		}

		if(hasNormals){
			dcl[i].stream = 0;
			dcl[i].offset = stride;
			dcl[i].type = D3DDECLTYPE_FLOAT3;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_NORMAL;
			dcl[i].usageIndex = 0;
			i++;
			s->geometryFlags |= 0x4;
			stride += 12;
		}

		// We expect some attributes to always be there, use the constant buffer as fallback
		if(!isPrelit){
			dcl[i].stream = 2;
			dcl[i].offset = offsetof(VertexConstantData, color);
			dcl[i].type = D3DDECLTYPE_D3DCOLOR;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_COLOR;
			dcl[i].usageIndex = 0;
			i++;
		}
		if(geo->numTexCoordSets == 0){
			dcl[i].stream = 2;
			dcl[i].offset = offsetof(VertexConstantData, texCoors[0]);
			dcl[i].type = D3DDECLTYPE_FLOAT2;
			dcl[i].method = D3DDECLMETHOD_DEFAULT;
			dcl[i].usage = D3DDECLUSAGE_TEXCOORD;
			dcl[i].usageIndex = 0;
			i++;
		}

		dcl[i] = D3DDECL_END();
		s->stride = stride;

		assert(header->vertexDeclaration == nil);
		header->vertexDeclaration = createVertexDeclaration((VertexElement*)dcl);

		assert(s->vertexBuffer == nil);
		s->vertexBuffer = createVertexBuffer(header->totalNumVertex*s->stride, 0, false);
	}else
		getDeclaration(header->vertexDeclaration, dcl);

	uint8 *verts = lockVertices(s->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);

	// Instance vertices
	if(!reinstance || geo->lockedSinceInst&Geometry::LOCKVERTICES){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_POSITION || dcl[i].usageIndex != 0; i++)
			;
		instV3d(vertFormatMap[dcl[i].type], verts + dcl[i].offset,
			geo->morphTargets[0].vertices,
			header->totalNumVertex,
			header->vertexStream[dcl[i].stream].stride);
	}

	// Instance prelight colors
	if(isPrelit && (!reinstance || geo->lockedSinceInst&Geometry::LOCKPRELIGHT)){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_COLOR || dcl[i].usageIndex != 0; i++)
			;
		InstanceData *inst = header->inst;
		uint32 n = header->numMeshes;
		while(n--){
			uint32 stride = header->vertexStream[dcl[i].stream].stride;
			inst->vertexAlpha = instColor(vertFormatMap[dcl[i].type],
				verts + dcl[i].offset + stride*inst->minVert,
				geo->colors + inst->minVert,
				inst->numVertices,
				stride);
			inst++;
		}
	}

	// Instance tex coords
	for(int32 n = 0; n < geo->numTexCoordSets; n++){
		if(!reinstance || geo->lockedSinceInst&(Geometry::LOCKTEXCOORDS<<n)){
			for(i = 0; dcl[i].usage != D3DDECLUSAGE_TEXCOORD || dcl[i].usageIndex != n; i++)
				;
			instTexCoords(vertFormatMap[dcl[i].type], verts + dcl[i].offset,
				geo->texCoords[n],
				header->totalNumVertex,
				header->vertexStream[dcl[i].stream].stride);
		}
	}

	// Instance normals
	if(hasNormals && (!reinstance || geo->lockedSinceInst&Geometry::LOCKNORMALS)){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_NORMAL || dcl[i].usageIndex != 0; i++)
			;
		instV3d(vertFormatMap[dcl[i].type], verts + dcl[i].offset,
			geo->morphTargets[0].normals,
			header->totalNumVertex,
			header->vertexStream[dcl[i].stream].stride);
	}
	unlockVertices(s->vertexBuffer);
}